

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_setdebughook(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQObject *in_RDI;
  SQObject o;
  int iVar2;
  SQInteger in_stack_ffffffffffffffe8;
  HSQUIRRELVM in_stack_fffffffffffffff0;
  
  pSVar1 = stack_get(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  iVar2 = (int)*(undefined8 *)&pSVar1->super_SQObject;
  if (((iVar2 == 0x8000100) || (iVar2 == 0x8000200)) || (iVar2 == 0x1000001)) {
    SQObjectPtr::operator=((SQObjectPtr *)o._0_8_,in_RDI);
    in_RDI[9]._unVal.pTable = (SQTable *)0x0;
    *(undefined1 *)&in_RDI[9]._type = (iVar2 == 0x1000001 ^ 0xff) & 1;
    SQVM::Pop((SQVM *)0x11584e);
  }
  return;
}

Assistant:

void sq_setdebughook(HSQUIRRELVM v)
{
    SQObject o = stack_get(v,-1);
    if(sq_isclosure(o) || sq_isnativeclosure(o) || sq_isnull(o)) {
        v->_debughook_closure = o;
        v->_debughook_native = NULL;
        v->_debughook = !sq_isnull(o);
        v->Pop();
    }
}